

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O3

RootBlock * __thiscall SQASTReader::readAst(SQASTReader *this,SQChar **sourcename)

{
  InputStream *pIVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_RAX;
  undefined4 extraout_var;
  RootBlock *pRVar4;
  byte bVar5;
  long lVar6;
  ulong uVar7;
  U64Conv conv;
  undefined8 local_38;
  
  local_38 = in_RAX;
  iVar3 = _setjmp((__jmp_buf_tag *)this->_errorjmp);
  if (iVar3 == 0) {
    bVar5 = 0;
    (*this->stream->_vptr_InputStream[4])(this->stream,0);
    bVar2 = checkMagic(this);
    if (!bVar2) {
      error(this,"Not a AST bionary data");
    }
    (**this->stream->_vptr_InputStream)();
    iVar3 = (**this->stream->_vptr_InputStream)();
    this->op_delta = (int)(char)iVar3;
    (**this->stream->_vptr_InputStream)();
    (**this->stream->_vptr_InputStream)();
    pIVar1 = this->stream;
    uVar7 = 0;
    do {
      iVar3 = (**pIVar1->_vptr_InputStream)(pIVar1);
      uVar7 = uVar7 | (ulong)((byte)iVar3 & 0x7f) << (bVar5 & 0x3f);
      bVar5 = bVar5 + 7;
    } while ((char)(byte)iVar3 < '\0');
    pIVar1 = this->stream;
    lVar6 = 0;
    do {
      iVar3 = (**pIVar1->_vptr_InputStream)(pIVar1);
      *(char *)((long)&local_38 + lVar6) = (char)iVar3;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    iVar3 = (*this->stream->_vptr_InputStream[3])();
    (*this->stream->_vptr_InputStream[4])(this->stream,local_38);
    readStringTable(this);
    (*this->stream->_vptr_InputStream[4])(this->stream,CONCAT44(extraout_var,iVar3));
    *sourcename = (this->stringVector)._vals[uVar7 & 0xffffffff];
    pRVar4 = readRoot(this);
  }
  else {
    pRVar4 = (RootBlock *)0x0;
  }
  return pRVar4;
}

Assistant:

RootBlock *SQASTReader::readAst(const SQChar *&sourcename) {
  if (setjmp(_errorjmp) == 0) {
    stream->seek(0);

    const char *m = MAGIC;

    if (!checkMagic()) {
      error("Not a AST bionary data");
    }

    uint8_t version = stream->readInt8();
    op_delta = stream->readInt8();
    uint8_t sq_int_size = stream->readInt8();
    uint8_t sq_float_size = stream->readInt8();

    uint32_t sourceNameIdx = stream->readUInt32();

    uintptr_t stringTableOffset = stream->readRawUInt64();
    size_t dataOffset = stream->pos();

    stream->seek(stringTableOffset);
    readStringTable();
    stream->seek(dataOffset);

    sourcename = getString(sourceNameIdx);

    RootBlock *root = readRoot();

    assert(stream->pos() == stringTableOffset);

    return root;
  }
  else {
    return nullptr;
  }
}